

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpp_message.cc
# Opt level: O0

void __thiscall
google::protobuf::compiler::cpp::MessageGenerator::GenerateByteSize
          (MessageGenerator *this,Printer *printer)

{
  pointer *this_00;
  FieldDescriptor *pFVar1;
  size_t printer_00;
  bool bVar2;
  int iVar3;
  int iVar4;
  MessageOptions *this_01;
  reference ppFVar5;
  ulong uVar6;
  size_type sVar7;
  const_reference ppFVar8;
  LogMessage *pLVar9;
  value_type this_02;
  string *psVar10;
  FieldGenerator *pFVar11;
  FileDescriptor *file;
  vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
  *in_RCX;
  FieldDescriptor *field_00;
  FieldDescriptor *field_01;
  size_type in_R9;
  Hex hex;
  Iterator IVar12;
  Iterator IVar13;
  StringPiece has_bits_var;
  bool local_4f9;
  string local_470;
  string local_450;
  FieldDescriptor *local_430;
  value_type field_4;
  Iterator __end4_3;
  Iterator __begin4_3;
  FieldRangeImpl<google::protobuf::OneofDescriptor> *__range4_3;
  value_type oneof;
  Iterator __end3;
  Iterator __begin3;
  OneOfRangeImpl *__range3;
  string local_3b8;
  byte local_392;
  byte local_391;
  bool need_extra_newline;
  FieldGenerator *pFStack_390;
  bool have_enclosing_if;
  FieldGenerator *generator;
  FieldDescriptor *field_3;
  int j;
  LogFinisher local_33a;
  byte local_339;
  LogMessage local_338;
  undefined1 local_300 [12];
  AlphaNum local_2f0;
  undefined1 local_2c0 [8];
  string chunk_mask_str;
  uint32_t chunk_mask;
  bool local_271;
  reference pvStack_270;
  bool have_outer_if;
  vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
  *chunk;
  int chunk_index;
  int cached_has_word_index;
  ColdChunkSkipper cold_skipper;
  __normal_iterator<std::vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>_*,_std::vector<std::vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>,_std::allocator<std::vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>_>_>_>
  local_200;
  const_iterator local_1f8;
  vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
  *local_1f0;
  __normal_iterator<std::vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>_*,_std::vector<std::vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>,_std::allocator<std::vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>_>_>_>
  local_1e8;
  __normal_iterator<std::vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>_*,_std::vector<std::vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>,_std::allocator<std::vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>_>_>_>
  local_1e0;
  const_iterator local_1d8;
  undefined1 local_1d0 [16];
  vector<std::vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>,_std::allocator<std::vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>_>_>
  chunks;
  FieldDescriptor *field_2;
  iterator __end4_2;
  iterator __begin4_2;
  vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
  *__range4_2;
  FieldDescriptor *field_1;
  iterator __end4_1;
  iterator __begin4_1;
  vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
  *__range4_1;
  char *local_148;
  string local_140;
  undefined1 local_120 [8];
  vector<unsigned_int,_std::allocator<unsigned_int>_> masks_for_has_bits;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  vars;
  FieldDescriptor *field;
  iterator __end4;
  iterator __begin4;
  vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
  *__range4;
  undefined1 local_90 [8];
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  vars_1;
  undefined1 local_50 [8];
  Formatter format;
  Printer *printer_local;
  MessageGenerator *this_local;
  AlphaNum *a;
  
  format.vars_._M_t._M_impl.super__Rb_tree_header._M_node_count = (size_t)printer;
  bVar2 = HasSimpleBaseClass(this->descriptor_,&this->options_);
  if (!bVar2) {
    Formatter::Formatter
              ((Formatter *)local_50,
               (Printer *)format.vars_._M_t._M_impl.super__Rb_tree_header._M_node_count,
               &this->variables_);
    this_01 = Descriptor::options(this->descriptor_);
    bVar2 = MessageOptions::message_set_wire_format(this_01);
    if (bVar2) {
      std::
      map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             *)local_90);
      SetUnknownFieldsVariable
                (this->descriptor_,&this->options_,
                 (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  *)local_90);
      Formatter::AddMap((Formatter *)local_50,
                        (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                         *)local_90);
      Formatter::operator()<>
                ((Formatter *)local_50,
                 "size_t $classname$::ByteSizeLong() const {\n$annotate_bytesize$// @@protoc_insertion_point(message_set_byte_size_start:$full_name$)\n  size_t total_size = _extensions_.MessageSetByteSize();\n  if ($have_unknown_fields$) {\n    total_size += ::$proto_ns$::internal::\n        ComputeUnknownMessageSetItemsSize($unknown_fields$);\n  }\n  int cached_size = ::$proto_ns$::internal::ToCachedSize(total_size);\n  SetCachedSize(cached_size);\n  return total_size;\n}\n"
                );
      std::
      map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::~map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              *)local_90);
    }
    else {
      if (1 < this->num_required_fields_) {
        Formatter::operator()<>
                  ((Formatter *)local_50,
                   "size_t $classname$::RequiredFieldsByteSizeFallback() const {\n// @@protoc_insertion_point(required_fields_byte_size_fallback_start:$full_name$)\n"
                  );
        Formatter::Indent((Formatter *)local_50);
        Formatter::operator()<>((Formatter *)local_50,"size_t total_size = 0;\n");
        __end4 = std::
                 vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                 ::begin(&this->optimized_order_);
        field = (FieldDescriptor *)
                std::
                vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                ::end(&this->optimized_order_);
        while (bVar2 = __gnu_cxx::operator!=
                                 (&__end4,(__normal_iterator<const_google::protobuf::FieldDescriptor_**,_std::vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>_>
                                           *)&field), bVar2) {
          ppFVar5 = __gnu_cxx::
                    __normal_iterator<const_google::protobuf::FieldDescriptor_**,_std::vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>_>
                    ::operator*(&__end4);
          pFVar1 = *ppFVar5;
          bVar2 = FieldDescriptor::is_required(pFVar1);
          if (bVar2) {
            FieldName_abi_cxx11_
                      ((string *)&vars._M_t._M_impl.super__Rb_tree_header._M_node_count,
                       (cpp *)pFVar1,field_00);
            Formatter::operator()
                      ((Formatter *)local_50,"\nif (_internal_has_$1$()) {\n",
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &vars._M_t._M_impl.super__Rb_tree_header._M_node_count);
            std::__cxx11::string::~string
                      ((string *)&vars._M_t._M_impl.super__Rb_tree_header._M_node_count);
            Formatter::Indent((Formatter *)local_50);
            PrintFieldComment<google::protobuf::FieldDescriptor>((Formatter *)local_50,pFVar1);
            pFVar11 = FieldGeneratorMap::get(&this->field_generators_,pFVar1);
            (*pFVar11->_vptr_FieldGenerator[0x14])
                      (pFVar11,format.vars_._M_t._M_impl.super__Rb_tree_header._M_node_count);
            Formatter::Outdent((Formatter *)local_50);
            Formatter::operator()<>((Formatter *)local_50,"}\n");
          }
          __gnu_cxx::
          __normal_iterator<const_google::protobuf::FieldDescriptor_**,_std::vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>_>
          ::operator++(&__end4);
        }
        Formatter::operator()<>((Formatter *)local_50,"\nreturn total_size;\n");
        Formatter::Outdent((Formatter *)local_50);
        Formatter::operator()<>((Formatter *)local_50,"}\n");
      }
      Formatter::operator()<>
                ((Formatter *)local_50,
                 "size_t $classname$::ByteSizeLong() const {\n$annotate_bytesize$// @@protoc_insertion_point(message_byte_size_start:$full_name$)\n"
                );
      Formatter::Indent((Formatter *)local_50);
      Formatter::operator()<>((Formatter *)local_50,"size_t total_size = 0;\n\n");
      iVar3 = Descriptor::extension_range_count(this->descriptor_);
      if (0 < iVar3) {
        Formatter::operator()<>((Formatter *)local_50,"total_size += _extensions_.ByteSize();\n\n");
      }
      this_00 = &masks_for_has_bits.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                 _M_impl.super__Vector_impl_data._M_end_of_storage;
      std::
      map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             *)this_00);
      SetUnknownFieldsVariable
                (this->descriptor_,&this->options_,
                 (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  *)this_00);
      Formatter::AddMap((Formatter *)local_50,
                        (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                         *)&masks_for_has_bits.
                            super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage);
      if (this->num_required_fields_ < 2) {
        __end4_2 = std::
                   vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                   ::begin(&this->optimized_order_);
        field_2 = (FieldDescriptor *)
                  std::
                  vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                  ::end(&this->optimized_order_);
        while (bVar2 = __gnu_cxx::operator!=
                                 (&__end4_2,
                                  (__normal_iterator<const_google::protobuf::FieldDescriptor_**,_std::vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>_>
                                   *)&field_2), bVar2) {
          ppFVar5 = __gnu_cxx::
                    __normal_iterator<const_google::protobuf::FieldDescriptor_**,_std::vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>_>
                    ::operator*(&__end4_2);
          pFVar1 = *ppFVar5;
          bVar2 = FieldDescriptor::is_required(pFVar1);
          if (bVar2) {
            PrintFieldComment<google::protobuf::FieldDescriptor>((Formatter *)local_50,pFVar1);
            FieldName_abi_cxx11_
                      ((string *)
                       &chunks.
                        super__Vector_base<std::vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>,_std::allocator<std::vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage,(cpp *)pFVar1,field_01);
            Formatter::operator()
                      ((Formatter *)local_50,"if (_internal_has_$1$()) {\n",
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &chunks.
                        super__Vector_base<std::vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>,_std::allocator<std::vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage);
            std::__cxx11::string::~string
                      ((string *)
                       &chunks.
                        super__Vector_base<std::vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>,_std::allocator<std::vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage);
            Formatter::Indent((Formatter *)local_50);
            pFVar11 = FieldGeneratorMap::get(&this->field_generators_,pFVar1);
            (*pFVar11->_vptr_FieldGenerator[0x14])
                      (pFVar11,format.vars_._M_t._M_impl.super__Rb_tree_header._M_node_count);
            Formatter::Outdent((Formatter *)local_50);
            Formatter::operator()<>((Formatter *)local_50,"}\n");
          }
          __gnu_cxx::
          __normal_iterator<const_google::protobuf::FieldDescriptor_**,_std::vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>_>
          ::operator++(&__end4_2);
        }
      }
      else {
        RequiredFieldsBitMask((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_120,this)
        ;
        stringpiece_internal::StringPiece::StringPiece((StringPiece *)&__range4_1,"_has_bits_");
        has_bits_var.length_ = in_R9;
        has_bits_var.ptr_ = local_148;
        (anonymous_namespace)::ConditionalToCheckBitmasks_abi_cxx11_
                  (&local_140,(_anonymous_namespace_ *)local_120,
                   (vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x1,SUB81(__range4_1,0),
                   has_bits_var);
        Formatter::operator()
                  ((Formatter *)local_50,"if ($1$) {  // All required fields are present.\n",
                   &local_140);
        std::__cxx11::string::~string((string *)&local_140);
        Formatter::Indent((Formatter *)local_50);
        __end4_1 = std::
                   vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                   ::begin(&this->optimized_order_);
        field_1 = (FieldDescriptor *)
                  std::
                  vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                  ::end(&this->optimized_order_);
        in_RCX = __range4_1;
        while (bVar2 = __gnu_cxx::operator!=
                                 (&__end4_1,
                                  (__normal_iterator<const_google::protobuf::FieldDescriptor_**,_std::vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>_>
                                   *)&field_1), bVar2) {
          ppFVar5 = __gnu_cxx::
                    __normal_iterator<const_google::protobuf::FieldDescriptor_**,_std::vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>_>
                    ::operator*(&__end4_1);
          pFVar1 = *ppFVar5;
          bVar2 = FieldDescriptor::is_required(pFVar1);
          if (bVar2) {
            PrintFieldComment<google::protobuf::FieldDescriptor>((Formatter *)local_50,pFVar1);
            pFVar11 = FieldGeneratorMap::get(&this->field_generators_,pFVar1);
            (*pFVar11->_vptr_FieldGenerator[0x14])
                      (pFVar11,format.vars_._M_t._M_impl.super__Rb_tree_header._M_node_count);
            Formatter::operator()<>((Formatter *)local_50,"\n");
          }
          __gnu_cxx::
          __normal_iterator<const_google::protobuf::FieldDescriptor_**,_std::vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>_>
          ::operator++(&__end4_1);
        }
        Formatter::Outdent((Formatter *)local_50);
        Formatter::operator()<>
                  ((Formatter *)local_50,
                   "} else {\n  total_size += RequiredFieldsByteSizeFallback();\n}\n");
        std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector
                  ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_120);
      }
      local_1d0._0_8_ = this;
      (anonymous_namespace)::
      CollectFields<google::protobuf::compiler::cpp::MessageGenerator::GenerateByteSize(google::protobuf::io::Printer*)::__0>
                ((vector<std::vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>,_std::allocator<std::vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>_>_>
                  *)(local_1d0 + 8),(_anonymous_namespace_ *)&this->optimized_order_,
                 (vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                  *)local_1d0,(anon_class_8_1_8991fb9c *)in_RCX);
      local_1e8._M_current =
           (vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
            *)std::
              vector<std::vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>,_std::allocator<std::vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>_>_>
              ::begin((vector<std::vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>,_std::allocator<std::vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>_>_>
                       *)(local_1d0 + 8));
      local_1f0 = (vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                   *)std::
                     vector<std::vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>,_std::allocator<std::vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>_>_>
                     ::end((vector<std::vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>,_std::allocator<std::vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>_>_>
                            *)(local_1d0 + 8));
      local_1e0 = std::
                  remove_if<__gnu_cxx::__normal_iterator<std::vector<google::protobuf::FieldDescriptor_const*,std::allocator<google::protobuf::FieldDescriptor_const*>>*,std::vector<std::vector<google::protobuf::FieldDescriptor_const*,std::allocator<google::protobuf::FieldDescriptor_const*>>,std::allocator<std::vector<google::protobuf::FieldDescriptor_const*,std::allocator<google::protobuf::FieldDescriptor_const*>>>>>,bool(*)(std::vector<google::protobuf::FieldDescriptor_const*,std::allocator<google::protobuf::FieldDescriptor_const*>>const&)>
                            (local_1e8,
                             (__normal_iterator<std::vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>_*,_std::vector<std::vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>,_std::allocator<std::vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>_>_>_>
                              )local_1f0,anon_unknown_0::IsRequired);
      __gnu_cxx::
      __normal_iterator<std::vector<google::protobuf::FieldDescriptor_const*,std::allocator<google::protobuf::FieldDescriptor_const*>>const*,std::vector<std::vector<google::protobuf::FieldDescriptor_const*,std::allocator<google::protobuf::FieldDescriptor_const*>>,std::allocator<std::vector<google::protobuf::FieldDescriptor_const*,std::allocator<google::protobuf::FieldDescriptor_const*>>>>>
      ::
      __normal_iterator<std::vector<google::protobuf::FieldDescriptor_const*,std::allocator<google::protobuf::FieldDescriptor_const*>>*>
                ((__normal_iterator<std::vector<google::protobuf::FieldDescriptor_const*,std::allocator<google::protobuf::FieldDescriptor_const*>>const*,std::vector<std::vector<google::protobuf::FieldDescriptor_const*,std::allocator<google::protobuf::FieldDescriptor_const*>>,std::allocator<std::vector<google::protobuf::FieldDescriptor_const*,std::allocator<google::protobuf::FieldDescriptor_const*>>>>>
                  *)&local_1d8,&local_1e0);
      local_200._M_current =
           (vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
            *)std::
              vector<std::vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>,_std::allocator<std::vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>_>_>
              ::end((vector<std::vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>,_std::allocator<std::vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>_>_>
                     *)(local_1d0 + 8));
      __gnu_cxx::
      __normal_iterator<std::vector<google::protobuf::FieldDescriptor_const*,std::allocator<google::protobuf::FieldDescriptor_const*>>const*,std::vector<std::vector<google::protobuf::FieldDescriptor_const*,std::allocator<google::protobuf::FieldDescriptor_const*>>,std::allocator<std::vector<google::protobuf::FieldDescriptor_const*,std::allocator<google::protobuf::FieldDescriptor_const*>>>>>
      ::
      __normal_iterator<std::vector<google::protobuf::FieldDescriptor_const*,std::allocator<google::protobuf::FieldDescriptor_const*>>*>
                ((__normal_iterator<std::vector<google::protobuf::FieldDescriptor_const*,std::allocator<google::protobuf::FieldDescriptor_const*>>const*,std::vector<std::vector<google::protobuf::FieldDescriptor_const*,std::allocator<google::protobuf::FieldDescriptor_const*>>,std::allocator<std::vector<google::protobuf::FieldDescriptor_const*,std::allocator<google::protobuf::FieldDescriptor_const*>>>>>
                  *)&local_1f8,&local_200);
      cold_skipper._80_8_ =
           std::
           vector<std::vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>,_std::allocator<std::vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>_>_>
           ::erase((vector<std::vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>,_std::allocator<std::vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>_>_>
                    *)(local_1d0 + 8),local_1d8,local_1f8);
      anon_unknown_0::ColdChunkSkipper::ColdChunkSkipper
                ((ColdChunkSkipper *)&chunk_index,&this->options_,
                 (vector<std::vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>,_std::allocator<std::vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>_>_>
                  *)(local_1d0 + 8),&this->has_bit_indices_,0.005);
      chunk._4_4_ = -1;
      Formatter::operator()<>
                ((Formatter *)local_50,
                 "$uint32$ cached_has_bits = 0;\n// Prevent compiler warnings about cached_has_bits being unused\n(void) cached_has_bits;\n\n"
                );
      for (chunk._0_4_ = 0; uVar6 = (ulong)(int)chunk,
          sVar7 = std::
                  vector<std::vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>,_std::allocator<std::vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>_>_>
                  ::size((vector<std::vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>,_std::allocator<std::vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>_>_>
                          *)(local_1d0 + 8)), uVar6 < sVar7; chunk._0_4_ = (int)chunk + 1) {
        pvStack_270 = std::
                      vector<std::vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>,_std::allocator<std::vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>_>_>
                      ::operator[]((vector<std::vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>,_std::allocator<std::vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>_>_>
                                    *)(local_1d0 + 8),(long)(int)chunk);
        sVar7 = std::
                vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                ::size(pvStack_270);
        local_4f9 = false;
        if (1 < sVar7) {
          ppFVar8 = std::
                    vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                    ::operator[](pvStack_270,0);
          iVar3 = HasWordIndex(this,*ppFVar8);
          local_4f9 = iVar3 != -1;
        }
        iVar4 = chunk._4_4_;
        iVar3 = (int)chunk;
        local_271 = local_4f9;
        std::allocator<char>::allocator();
        std::__cxx11::string::string
                  ((string *)&chunk_mask,"",(allocator *)(chunk_mask_str.field_2._M_local_buf + 0xf)
                  );
        anon_unknown_0::ColdChunkSkipper::OnStartChunk
                  ((ColdChunkSkipper *)&chunk_index,iVar3,iVar4,(string *)&chunk_mask,
                   (Printer *)format.vars_._M_t._M_impl.super__Rb_tree_header._M_node_count);
        std::__cxx11::string::~string((string *)&chunk_mask);
        std::allocator<char>::~allocator
                  ((allocator<char> *)(chunk_mask_str.field_2._M_local_buf + 0xf));
        if ((local_271 & 1U) != 0) {
          chunk_mask_str.field_2._8_4_ =
               anon_unknown_0::GenChunkMask(pvStack_270,&this->has_bit_indices_);
          strings::Hex::Hex<unsigned_int>((Hex *)local_300,chunk_mask_str.field_2._8_4_,ZERO_PAD_8);
          hex._12_4_ = 0;
          hex.value = local_300._0_8_;
          hex.spec = local_300._8_4_;
          strings::AlphaNum::AlphaNum(&local_2f0,hex);
          StrCat_abi_cxx11_((string *)local_2c0,(protobuf *)&local_2f0,a);
          local_339 = 0;
          iVar3 = anon_unknown_0::popcnt(chunk_mask_str.field_2._8_4_);
          if (iVar3 < 2) {
            internal::LogMessage::LogMessage
                      (&local_338,LOGLEVEL_DFATAL,
                       "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/deps/protobuf/src/google/protobuf/compiler/cpp/cpp_message.cc"
                       ,0x1127);
            local_339 = 1;
            pLVar9 = internal::LogMessage::operator<<
                               (&local_338,"CHECK failed: (2) <= (popcnt(chunk_mask)): ");
            internal::LogFinisher::operator=(&local_33a,pLVar9);
          }
          if ((local_339 & 1) != 0) {
            internal::LogMessage::~LogMessage(&local_338);
          }
          field_3._7_1_ = 0;
          iVar3 = anon_unknown_0::popcnt(chunk_mask_str.field_2._8_4_);
          if (8 < iVar3) {
            internal::LogMessage::LogMessage
                      ((LogMessage *)&j,LOGLEVEL_DFATAL,
                       "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/deps/protobuf/src/google/protobuf/compiler/cpp/cpp_message.cc"
                       ,0x1128);
            field_3._7_1_ = 1;
            pLVar9 = internal::LogMessage::operator<<
                               ((LogMessage *)&j,"CHECK failed: (8) >= (popcnt(chunk_mask)): ");
            internal::LogFinisher::operator=((LogFinisher *)((long)&field_3 + 6),pLVar9);
          }
          if ((field_3._7_1_ & 1) != 0) {
            internal::LogMessage::~LogMessage((LogMessage *)&j);
          }
          iVar3 = chunk._4_4_;
          ppFVar8 = std::
                    vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                    ::front(pvStack_270);
          iVar4 = HasWordIndex(this,*ppFVar8);
          if (iVar3 != iVar4) {
            ppFVar8 = std::
                      vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                      ::front(pvStack_270);
            chunk._4_4_ = HasWordIndex(this,*ppFVar8);
            Formatter::operator()
                      ((Formatter *)local_50,"cached_has_bits = _has_bits_[$1$];\n",
                       (int *)((long)&chunk + 4));
          }
          Formatter::operator()
                    ((Formatter *)local_50,"if (cached_has_bits & 0x$1$u) {\n",
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_2c0)
          ;
          Formatter::Indent((Formatter *)local_50);
          std::__cxx11::string::~string((string *)local_2c0);
        }
        for (field_3._0_4_ = 0; uVar6 = (ulong)(int)field_3,
            sVar7 = std::
                    vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                    ::size(pvStack_270), uVar6 < sVar7; field_3._0_4_ = (int)field_3 + 1) {
          ppFVar8 = std::
                    vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                    ::operator[](pvStack_270,(long)(int)field_3);
          generator = (FieldGenerator *)*ppFVar8;
          pFStack_390 = FieldGeneratorMap::get
                                  (&this->field_generators_,(FieldDescriptor *)generator);
          local_391 = 0;
          local_392 = 0;
          PrintFieldComment<google::protobuf::FieldDescriptor>
                    ((Formatter *)local_50,(FieldDescriptor *)generator);
          bVar2 = FieldDescriptor::is_repeated((FieldDescriptor *)generator);
          if (bVar2) {
            local_392 = 1;
          }
          else {
            bVar2 = HasHasbit((FieldDescriptor *)generator);
            printer_00 = format.vars_._M_t._M_impl.super__Rb_tree_header._M_node_count;
            if (bVar2) {
              anon_unknown_0::PrintPresenceCheck
                        ((Formatter *)local_50,(FieldDescriptor *)generator,&this->has_bit_indices_,
                         (Printer *)format.vars_._M_t._M_impl.super__Rb_tree_header._M_node_count,
                         (int *)((long)&chunk + 4));
              local_391 = 1;
            }
            else {
              std::allocator<char>::allocator();
              std::__cxx11::string::string
                        ((string *)&local_3b8,"this->",(allocator *)((long)&__range3 + 7));
              local_391 = anon_unknown_0::EmitFieldNonDefaultCondition
                                    ((Printer *)printer_00,&local_3b8,(FieldDescriptor *)generator);
              std::__cxx11::string::~string((string *)&local_3b8);
              std::allocator<char>::~allocator((allocator<char> *)((long)&__range3 + 7));
            }
          }
          (*pFStack_390->_vptr_FieldGenerator[0x14])
                    (pFStack_390,format.vars_._M_t._M_impl.super__Rb_tree_header._M_node_count);
          if ((local_391 & 1) != 0) {
            Formatter::Outdent((Formatter *)local_50);
            Formatter::operator()<>((Formatter *)local_50,"}\n\n");
          }
          if ((local_392 & 1) != 0) {
            Formatter::operator()<>((Formatter *)local_50,"\n");
          }
        }
        if ((local_271 & 1U) != 0) {
          Formatter::Outdent((Formatter *)local_50);
          Formatter::operator()<>((Formatter *)local_50,"}\n");
        }
        bVar2 = anon_unknown_0::ColdChunkSkipper::OnEndChunk
                          ((ColdChunkSkipper *)&chunk_index,(int)chunk,
                           (Printer *)format.vars_._M_t._M_impl.super__Rb_tree_header._M_node_count)
        ;
        if (bVar2) {
          chunk._4_4_ = -1;
        }
      }
      __begin3.descriptor = (Descriptor *)OneOfRange(this->descriptor_);
      IVar12 = OneOfRangeImpl::begin((OneOfRangeImpl *)&__begin3.descriptor);
      __begin3._0_8_ = IVar12.descriptor;
      __end3.descriptor._0_4_ = IVar12.idx;
      IVar12 = OneOfRangeImpl::end((OneOfRangeImpl *)&__begin3.descriptor);
      __end3._0_8_ = IVar12.descriptor;
      oneof._0_4_ = IVar12.idx;
      while (bVar2 = cpp::operator!=((Iterator *)&__end3.descriptor,(Iterator *)&oneof), bVar2) {
        this_02 = OneOfRangeImpl::Iterator::operator*((Iterator *)&__end3.descriptor);
        psVar10 = OneofDescriptor::name_abi_cxx11_(this_02);
        Formatter::operator()((Formatter *)local_50,"switch ($1$_case()) {\n",psVar10);
        Formatter::Indent((Formatter *)local_50);
        __begin4_3.descriptor =
             (OneofDescriptor *)FieldRange<google::protobuf::OneofDescriptor>(this_02);
        IVar13 = FieldRangeImpl<google::protobuf::OneofDescriptor>::begin
                           ((FieldRangeImpl<google::protobuf::OneofDescriptor> *)
                            &__begin4_3.descriptor);
        __begin4_3._0_8_ = IVar13.descriptor;
        __end4_3.descriptor._0_4_ = IVar13.idx;
        IVar13 = FieldRangeImpl<google::protobuf::OneofDescriptor>::end
                           ((FieldRangeImpl<google::protobuf::OneofDescriptor> *)
                            &__begin4_3.descriptor);
        __end4_3._0_8_ = IVar13.descriptor;
        field_4._0_4_ = IVar13.idx;
        while (bVar2 = cpp::operator!=((Iterator *)&__end4_3.descriptor,(Iterator *)&field_4), bVar2
              ) {
          local_430 = FieldRangeImpl<google::protobuf::OneofDescriptor>::Iterator::operator*
                                ((Iterator *)&__end4_3.descriptor);
          PrintFieldComment<google::protobuf::FieldDescriptor>((Formatter *)local_50,local_430);
          psVar10 = FieldDescriptor::name_abi_cxx11_(local_430);
          UnderscoresToCamelCase(&local_450,psVar10,true);
          Formatter::operator()((Formatter *)local_50,"case k$1$: {\n",&local_450);
          std::__cxx11::string::~string((string *)&local_450);
          Formatter::Indent((Formatter *)local_50);
          bVar2 = IsFieldStripped(local_430,&this->options_);
          if (!bVar2) {
            pFVar11 = FieldGeneratorMap::get(&this->field_generators_,local_430);
            (*pFVar11->_vptr_FieldGenerator[0x14])
                      (pFVar11,format.vars_._M_t._M_impl.super__Rb_tree_header._M_node_count);
          }
          Formatter::operator()<>((Formatter *)local_50,"break;\n");
          Formatter::Outdent((Formatter *)local_50);
          Formatter::operator()<>((Formatter *)local_50,"}\n");
          FieldRangeImpl<google::protobuf::OneofDescriptor>::Iterator::operator++
                    ((Iterator *)&__end4_3.descriptor);
        }
        psVar10 = OneofDescriptor::name_abi_cxx11_(this_02);
        ToUpper(&local_470,psVar10);
        Formatter::operator()((Formatter *)local_50,"case $1$_NOT_SET: {\n  break;\n}\n",&local_470)
        ;
        std::__cxx11::string::~string((string *)&local_470);
        Formatter::Outdent((Formatter *)local_50);
        Formatter::operator()<>((Formatter *)local_50,"}\n");
        OneOfRangeImpl::Iterator::operator++((Iterator *)&__end3.descriptor);
      }
      if (this->num_weak_fields_ != 0) {
        Formatter::operator()<>
                  ((Formatter *)local_50,"total_size += _weak_field_map_.ByteSizeLong();\n");
      }
      file = Descriptor::file(this->descriptor_);
      bVar2 = UseUnknownFieldSet(file,&this->options_);
      if (bVar2) {
        Formatter::operator()<>
                  ((Formatter *)local_50,
                   "return MaybeComputeUnknownFieldsSize(total_size, &_cached_size_);\n");
      }
      else {
        Formatter::operator()<>
                  ((Formatter *)local_50,"if (PROTOBUF_PREDICT_FALSE($have_unknown_fields$)) {\n");
        Formatter::operator()<>((Formatter *)local_50,"  total_size += $unknown_fields$.size();\n");
        Formatter::operator()<>((Formatter *)local_50,"}\n");
        Formatter::operator()<>
                  ((Formatter *)local_50,
                   "int cached_size = ::$proto_ns$::internal::ToCachedSize(total_size);\nSetCachedSize(cached_size);\nreturn total_size;\n"
                  );
      }
      Formatter::Outdent((Formatter *)local_50);
      Formatter::operator()<>((Formatter *)local_50,"}\n");
      anon_unknown_0::ColdChunkSkipper::~ColdChunkSkipper((ColdChunkSkipper *)&chunk_index);
      std::
      vector<std::vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>,_std::allocator<std::vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>_>_>
      ::~vector((vector<std::vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>,_std::allocator<std::vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>_>_>
                 *)(local_1d0 + 8));
      std::
      map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::~map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              *)&masks_for_has_bits.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                 _M_impl.super__Vector_impl_data._M_end_of_storage);
    }
    Formatter::~Formatter((Formatter *)local_50);
  }
  return;
}

Assistant:

void MessageGenerator::GenerateByteSize(io::Printer* printer) {
  if (HasSimpleBaseClass(descriptor_, options_)) return;
  Formatter format(printer, variables_);

  if (descriptor_->options().message_set_wire_format()) {
    // Special-case MessageSet.
    std::map<std::string, std::string> vars;
    SetUnknownFieldsVariable(descriptor_, options_, &vars);
    format.AddMap(vars);
    format(
        "size_t $classname$::ByteSizeLong() const {\n"
        "$annotate_bytesize$"
        "// @@protoc_insertion_point(message_set_byte_size_start:$full_name$)\n"
        "  size_t total_size = _extensions_.MessageSetByteSize();\n"
        "  if ($have_unknown_fields$) {\n"
        "    total_size += ::$proto_ns$::internal::\n"
        "        ComputeUnknownMessageSetItemsSize($unknown_fields$);\n"
        "  }\n"
        "  int cached_size = "
        "::$proto_ns$::internal::ToCachedSize(total_size);\n"
        "  SetCachedSize(cached_size);\n"
        "  return total_size;\n"
        "}\n");
    return;
  }

  if (num_required_fields_ > 1) {
    // Emit a function (rarely used, we hope) that handles the required fields
    // by checking for each one individually.
    format(
        "size_t $classname$::RequiredFieldsByteSizeFallback() const {\n"
        "// @@protoc_insertion_point(required_fields_byte_size_fallback_start:"
        "$full_name$)\n");
    format.Indent();
    format("size_t total_size = 0;\n");
    for (auto field : optimized_order_) {
      if (field->is_required()) {
        format(
            "\n"
            "if (_internal_has_$1$()) {\n",
            FieldName(field));
        format.Indent();
        PrintFieldComment(format, field);
        field_generators_.get(field).GenerateByteSize(printer);
        format.Outdent();
        format("}\n");
      }
    }
    format(
        "\n"
        "return total_size;\n");
    format.Outdent();
    format("}\n");
  }

  format(
      "size_t $classname$::ByteSizeLong() const {\n"
      "$annotate_bytesize$"
      "// @@protoc_insertion_point(message_byte_size_start:$full_name$)\n");
  format.Indent();
  format(
      "size_t total_size = 0;\n"
      "\n");

  if (descriptor_->extension_range_count() > 0) {
    format(
        "total_size += _extensions_.ByteSize();\n"
        "\n");
  }

  std::map<std::string, std::string> vars;
  SetUnknownFieldsVariable(descriptor_, options_, &vars);
  format.AddMap(vars);

  // Handle required fields (if any).  We expect all of them to be
  // present, so emit one conditional that checks for that.  If they are all
  // present then the fast path executes; otherwise the slow path executes.
  if (num_required_fields_ > 1) {
    // The fast path works if all required fields are present.
    const std::vector<uint32_t> masks_for_has_bits = RequiredFieldsBitMask();
    format("if ($1$) {  // All required fields are present.\n",
           ConditionalToCheckBitmasks(masks_for_has_bits));
    format.Indent();
    // Oneof fields cannot be required, so optimized_order_ contains all of the
    // fields that we need to potentially emit.
    for (auto field : optimized_order_) {
      if (!field->is_required()) continue;
      PrintFieldComment(format, field);
      field_generators_.get(field).GenerateByteSize(printer);
      format("\n");
    }
    format.Outdent();
    format(
        "} else {\n"  // the slow path
        "  total_size += RequiredFieldsByteSizeFallback();\n"
        "}\n");
  } else {
    // num_required_fields_ <= 1: no need to be tricky
    for (auto field : optimized_order_) {
      if (!field->is_required()) continue;
      PrintFieldComment(format, field);
      format("if (_internal_has_$1$()) {\n", FieldName(field));
      format.Indent();
      field_generators_.get(field).GenerateByteSize(printer);
      format.Outdent();
      format("}\n");
    }
  }

  std::vector<std::vector<const FieldDescriptor*>> chunks = CollectFields(
      optimized_order_,
      [&](const FieldDescriptor* a, const FieldDescriptor* b) -> bool {
        return a->label() == b->label() && HasByteIndex(a) == HasByteIndex(b);
      });

  // Remove chunks with required fields.
  chunks.erase(std::remove_if(chunks.begin(), chunks.end(), IsRequired),
               chunks.end());

  ColdChunkSkipper cold_skipper(options_, chunks, has_bit_indices_, kColdRatio);
  int cached_has_word_index = -1;

  format(
      "$uint32$ cached_has_bits = 0;\n"
      "// Prevent compiler warnings about cached_has_bits being unused\n"
      "(void) cached_has_bits;\n\n");

  for (int chunk_index = 0; chunk_index < chunks.size(); chunk_index++) {
    const std::vector<const FieldDescriptor*>& chunk = chunks[chunk_index];
    const bool have_outer_if =
        chunk.size() > 1 && HasWordIndex(chunk[0]) != kNoHasbit;
    cold_skipper.OnStartChunk(chunk_index, cached_has_word_index, "", printer);

    if (have_outer_if) {
      // Emit an if() that will let us skip the whole chunk if none are set.
      uint32_t chunk_mask = GenChunkMask(chunk, has_bit_indices_);
      std::string chunk_mask_str =
          StrCat(strings::Hex(chunk_mask, strings::ZERO_PAD_8));

      // Check (up to) 8 has_bits at a time if we have more than one field in
      // this chunk.  Due to field layout ordering, we may check
      // _has_bits_[last_chunk * 8 / 32] multiple times.
      GOOGLE_DCHECK_LE(2, popcnt(chunk_mask));
      GOOGLE_DCHECK_GE(8, popcnt(chunk_mask));

      if (cached_has_word_index != HasWordIndex(chunk.front())) {
        cached_has_word_index = HasWordIndex(chunk.front());
        format("cached_has_bits = _has_bits_[$1$];\n", cached_has_word_index);
      }
      format("if (cached_has_bits & 0x$1$u) {\n", chunk_mask_str);
      format.Indent();
    }

    // Go back and emit checks for each of the fields we processed.
    for (int j = 0; j < chunk.size(); j++) {
      const FieldDescriptor* field = chunk[j];
      const FieldGenerator& generator = field_generators_.get(field);
      bool have_enclosing_if = false;
      bool need_extra_newline = false;

      PrintFieldComment(format, field);

      if (field->is_repeated()) {
        // No presence check is required.
        need_extra_newline = true;
      } else if (HasHasbit(field)) {
        PrintPresenceCheck(format, field, has_bit_indices_, printer,
                           &cached_has_word_index);
        have_enclosing_if = true;
      } else {
        // Without field presence: field is serialized only if it has a
        // non-default value.
        have_enclosing_if =
            EmitFieldNonDefaultCondition(printer, "this->", field);
      }

      generator.GenerateByteSize(printer);

      if (have_enclosing_if) {
        format.Outdent();
        format(
            "}\n"
            "\n");
      }
      if (need_extra_newline) {
        format("\n");
      }
    }

    if (have_outer_if) {
      format.Outdent();
      format("}\n");
    }

    if (cold_skipper.OnEndChunk(chunk_index, printer)) {
      // Reset here as it may have been updated in just closed if statement.
      cached_has_word_index = -1;
    }
  }

  // Fields inside a oneof don't use _has_bits_ so we count them in a separate
  // pass.
  for (auto oneof : OneOfRange(descriptor_)) {
    format("switch ($1$_case()) {\n", oneof->name());
    format.Indent();
    for (auto field : FieldRange(oneof)) {
      PrintFieldComment(format, field);
      format("case k$1$: {\n", UnderscoresToCamelCase(field->name(), true));
      format.Indent();
      if (!IsFieldStripped(field, options_)) {
        field_generators_.get(field).GenerateByteSize(printer);
      }
      format("break;\n");
      format.Outdent();
      format("}\n");
    }
    format(
        "case $1$_NOT_SET: {\n"
        "  break;\n"
        "}\n",
        ToUpper(oneof->name()));
    format.Outdent();
    format("}\n");
  }

  if (num_weak_fields_) {
    // TagSize + MessageSize
    format("total_size += _weak_field_map_.ByteSizeLong();\n");
  }

  if (UseUnknownFieldSet(descriptor_->file(), options_)) {
    // We go out of our way to put the computation of the uncommon path of
    // unknown fields in tail position. This allows for better code generation
    // of this function for simple protos.
    format(
        "return MaybeComputeUnknownFieldsSize(total_size, &_cached_size_);\n");
  } else {
    format("if (PROTOBUF_PREDICT_FALSE($have_unknown_fields$)) {\n");
    format("  total_size += $unknown_fields$.size();\n");
    format("}\n");

    // We update _cached_size_ even though this is a const method.  Because
    // const methods might be called concurrently this needs to be atomic
    // operations or the program is undefined.  In practice, since any
    // concurrent writes will be writing the exact same value, normal writes
    // will work on all common processors. We use a dedicated wrapper class to
    // abstract away the underlying atomic. This makes it easier on platforms
    // where even relaxed memory order might have perf impact to replace it with
    // ordinary loads and stores.
    format(
        "int cached_size = ::$proto_ns$::internal::ToCachedSize(total_size);\n"
        "SetCachedSize(cached_size);\n"
        "return total_size;\n");
  }

  format.Outdent();
  format("}\n");
}